

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> __thiscall
duckdb::Connection::TableInfo(Connection *this,string *table_name)

{
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,anon_var_dwarf_4b71df5 + 9,&local_59);
  ::std::__cxx11::string::string((string *)&local_58,"main",&local_5a);
  TableInfo(this,table_name,&local_38,&local_58);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_38);
  return (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
         (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)this;
}

Assistant:

unique_ptr<TableDescription> Connection::TableInfo(const string &table_name) {
	return TableInfo(INVALID_CATALOG, DEFAULT_SCHEMA, table_name);
}